

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

void init_mv_cost_params(MV_COST_PARAMS *mv_cost_params,MvCosts *mv_costs,MV *ref_mv,int errorperbit
                        ,int sadperbit)

{
  FULLPEL_MV FVar1;
  undefined4 in_ECX;
  MV *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  
  *in_RDI = in_RDX;
  FVar1 = get_fullmv_from_mv(in_RDX);
  *(FULLPEL_MV *)(in_RDI + 1) = FVar1;
  *(undefined1 *)((long)in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 5) = in_ECX;
  *(undefined4 *)((long)in_RDI + 0x2c) = in_R8D;
  if (in_RSI != 0) {
    in_RDI[2] = in_RSI;
    in_RDI[3] = **(undefined8 **)(in_RSI + 0x80020);
    in_RDI[4] = *(undefined8 *)(*(long *)(in_RSI + 0x80020) + 8);
  }
  return;
}

Assistant:

static inline void init_mv_cost_params(MV_COST_PARAMS *mv_cost_params,
                                       const MvCosts *mv_costs,
                                       const MV *ref_mv, int errorperbit,
                                       int sadperbit) {
  mv_cost_params->ref_mv = ref_mv;
  mv_cost_params->full_ref_mv = get_fullmv_from_mv(ref_mv);
  mv_cost_params->mv_cost_type = MV_COST_ENTROPY;
  mv_cost_params->error_per_bit = errorperbit;
  mv_cost_params->sad_per_bit = sadperbit;
  // For allintra encoding mode, 'mv_costs' is not allocated. Hence, the
  // population of mvjcost and mvcost are avoided. In case of IntraBC, these
  // values are populated from 'dv_costs' in av1_set_ms_to_intra_mode().
  if (mv_costs != NULL) {
    mv_cost_params->mvjcost = mv_costs->nmv_joint_cost;
    mv_cost_params->mvcost[0] = mv_costs->mv_cost_stack[0];
    mv_cost_params->mvcost[1] = mv_costs->mv_cost_stack[1];
  }
}